

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_user_geometry.h
# Opt level: O3

PrimInfoMB * __thiscall
embree::sse2::UserGeometryISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,UserGeometryISA *this,mvector<PrimRefMB> *prims,
          BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  PrimRefMB *pPVar1;
  int iVar2;
  undefined4 uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [12];
  undefined1 extraout_var [12];
  undefined1 auVar14 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar15;
  uint uVar16;
  uint uVar21;
  undefined1 auVar17 [12];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar20;
  float fVar22;
  undefined1 auVar23 [16];
  BBox1f BVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar33;
  float fVar34;
  float fVar35;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> bi;
  BBox3fa box;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  undefined8 local_1e8;
  float fStack_1e0;
  float fStack_1dc;
  undefined8 local_1d8;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  unsigned_long local_1b8;
  size_t local_1b0;
  BBox1f *local_1a8;
  ulong local_1a0;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_178;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_168;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  float fStack_130;
  float fStack_12c;
  undefined8 local_128;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  PrimInfoMB *local_f0;
  mvector<PrimRefMB> *local_e8;
  range<unsigned_long> *local_e0;
  undefined8 local_d8;
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  float fStack_c0;
  float fStack_bc;
  undefined8 local_b8;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  float fStack_a0;
  float fStack_9c;
  void *local_90;
  float local_88;
  int local_84;
  undefined8 *local_80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar5 = r->_begin;
  local_f0 = __return_storage_ptr__;
  local_58 = _DAT_01f7aa00;
  local_68 = _DAT_01f7aa00;
  local_78 = _DAT_01f7a9f0;
  if (uVar5 < r->_end) {
    local_48 = 0.0;
    fStack_44 = 1.0;
    uStack_40 = 0;
    uStack_3c = 0;
    fVar25 = 1.0;
    local_1b8 = 0;
    local_178.m128 = _DAT_01f7a9f0;
    _local_188 = _DAT_01f7a9f0;
    local_168 = _DAT_01f7aa00;
    local_1b0 = 0;
    uVar4 = 0;
    fVar34 = 0.0;
    local_1a8 = t0t1;
    local_e8 = prims;
    local_e0 = r;
    do {
      BVar24 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range;
      auVar13._4_4_ = BVar24.lower;
      fVar27 = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
      fVar12 = local_1a8->lower;
      fVar11 = local_1a8->upper;
      auVar13._0_4_ = BVar24.upper - auVar13._4_4_;
      fVar9 = floorf(((fVar12 - auVar13._4_4_) / auVar13._0_4_) * 1.0000002 * fVar27);
      fVar10 = 0.0;
      if (0.0 <= fVar9) {
        fVar10 = fVar9;
      }
      fVar9 = ceilf(((fVar11 - auVar13._4_4_) / auVar13._0_4_) * 0.99999976 * fVar27);
      if (fVar27 <= fVar9) {
        fVar9 = fVar27;
      }
      auVar13._0_4_ = (float)uVar5;
      if ((uint)(int)fVar10 <= (uint)(int)fVar9) {
        uVar7 = (ulong)(int)fVar10;
        do {
          local_1e8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
          fStack_1dc = (float)uVar7;
          local_1d8 = &local_118;
          fStack_1e0 = auVar13._0_4_;
          uVar3 = (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                            (&local_1e8);
          auVar14._0_4_ =
               -(uint)((local_108 < 1.844e+18 && -1.844e+18 < local_118) && local_118 <= local_108);
          auVar14._4_4_ =
               -(uint)((fStack_104 < 1.844e+18 && -1.844e+18 < fStack_114) &&
                      fStack_114 <= fStack_104);
          auVar14._8_4_ =
               -(uint)((fStack_100 < 1.844e+18 && -1.844e+18 < fStack_110) &&
                      fStack_110 <= fStack_100);
          auVar14._12_4_ =
               -(uint)((fStack_fc < 1.844e+18 && -1.844e+18 < fStack_10c) && fStack_10c <= fStack_fc
                      );
          uVar3 = movmskps(uVar3,auVar14);
          if ((~(byte)uVar3 & 7) != 0) goto LAB_0094a79d;
          uVar7 = uVar7 + 1;
        } while (uVar7 <= (ulong)(long)(int)fVar9);
        fVar27 = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
        fVar12 = local_1a8->lower;
        fVar11 = local_1a8->upper;
        BVar24 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range;
      }
      auVar13._4_4_ = BVar24.lower;
      fVar10 = BVar24.upper - auVar13._4_4_;
      fVar9 = (fVar12 - auVar13._4_4_) / fVar10;
      fVar10 = (fVar11 - auVar13._4_4_) / fVar10;
      local_1c8 = fVar27 * fVar10;
      fVar11 = floorf(fVar27 * fVar9);
      fVar12 = ceilf(local_1c8);
      iVar6 = (int)fVar11;
      if (fVar11 <= 0.0) {
        fVar11 = 0.0;
      }
      auVar13._4_4_ = fVar12;
      if (fVar27 <= fVar12) {
        auVar13._4_4_ = fVar27;
      }
      register0x00001204 = extraout_var;
      local_198._0_4_ = auVar13._4_4_;
      fStack_1dc = (float)(int)fVar11;
      if (iVar6 < 0) {
        iVar6 = -1;
      }
      iVar2 = (int)fVar27 + 1;
      if ((int)fVar12 < (int)fVar27 + 1) {
        iVar2 = (int)fVar12;
      }
      local_1e8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
      local_1d8 = &local_118;
      fStack_1e0 = auVar13._0_4_;
      local_158 = fStack_1dc;
      (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_1e8);
      local_b8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
      local_1a0 = uVar5;
      local_148 = (float)(int)auVar13._4_4_;
      fStack_b0 = auVar13._0_4_;
      fStack_ac = (float)(int)auVar13._4_4_;
      local_a8 = &local_1e8;
      (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_b8);
      uVar5 = local_1a0;
      fVar11 = fVar27 * fVar9 - fVar11;
      fVar12 = (float)local_1a0;
      if (iVar2 - iVar6 == 1) {
        if (fVar11 <= 0.0) {
          fVar11 = 0.0;
        }
        fVar27 = 1.0 - fVar11;
        auVar31._0_4_ = fVar27 * local_118 + fVar11 * (float)local_1e8;
        auVar31._4_4_ = fVar27 * fStack_114 + fVar11 * local_1e8._4_4_;
        auVar31._8_4_ = fVar27 * fStack_110 + fVar11 * fStack_1e0;
        auVar28._0_4_ = fVar27 * local_108 + fVar11 * (float)local_1d8;
        auVar28._4_4_ = fVar27 * fStack_104 + fVar11 * local_1d8._4_4_;
        auVar28._8_4_ = fVar27 * fStack_100 + fVar11 * fStack_1d0;
        fVar11 = (float)local_198._0_4_ - local_1c8;
        if (fVar11 <= 0.0) {
          fVar11 = 0.0;
        }
        fVar27 = 1.0 - fVar11;
        auVar13._0_4_ = (float)local_1e8 * fVar27 + local_118 * fVar11;
        auVar13._4_4_ = local_1e8._4_4_ * fVar27 + fStack_114 * fVar11;
        auVar13._8_4_ = fStack_1e0 * fVar27 + fStack_110 * fVar11;
        auVar17._0_4_ = fVar27 * (float)local_1d8 + fVar11 * local_108;
        auVar17._4_4_ = fVar27 * local_1d8._4_4_ + fVar11 * fStack_104;
        auVar17._8_4_ = fVar27 * fStack_1d0 + fVar11 * fStack_100;
      }
      else {
        fStack_cc = (float)((int)local_158 + 1);
        local_d8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
        fStack_d0 = fVar12;
        local_c8 = &local_b8;
        (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_d8)
        ;
        fStack_12c = (float)((int)local_148 + -1);
        local_138 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
        fStack_130 = fVar12;
        local_128 = &local_d8;
        (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                  (&local_138);
        if (fVar11 <= 0.0) {
          fVar11 = 0.0;
        }
        auVar13._0_4_ = 1.0 - fVar11;
        auVar31._0_4_ = local_118 * auVar13._0_4_ + (float)local_b8 * fVar11;
        auVar31._4_4_ = fStack_114 * auVar13._0_4_ + local_b8._4_4_ * fVar11;
        auVar31._8_4_ = fStack_110 * auVar13._0_4_ + fStack_b0 * fVar11;
        auVar32._12_4_ = fStack_10c * auVar13._0_4_ + fStack_ac * fVar11;
        auVar32._0_12_ = auVar31;
        auVar28._0_4_ = auVar13._0_4_ * local_108 + fVar11 * (float)local_a8;
        auVar28._4_4_ = auVar13._0_4_ * fStack_104 + fVar11 * local_a8._4_4_;
        auVar28._8_4_ = auVar13._0_4_ * fStack_100 + fVar11 * fStack_a0;
        auVar29._12_4_ = auVar13._0_4_ * fStack_fc + fVar11 * fStack_9c;
        auVar29._0_12_ = auVar28;
        fVar11 = (float)local_198._0_4_ - local_1c8;
        if (fVar11 <= 0.0) {
          fVar11 = 0.0;
        }
        fVar26 = 1.0 - fVar11;
        auVar13._0_4_ = (float)local_1e8 * fVar26 + (float)local_d8 * fVar11;
        auVar13._4_4_ = local_1e8._4_4_ * fVar26 + local_d8._4_4_ * fVar11;
        auVar13._8_4_ = fStack_1e0 * fVar26 + fStack_d0 * fVar11;
        fVar35 = fStack_1dc * fVar26 + fStack_cc * fVar11;
        auVar17._0_4_ = fVar26 * (float)local_1d8 + fVar11 * (float)local_c8;
        auVar17._4_4_ = fVar26 * local_1d8._4_4_ + fVar11 * local_c8._4_4_;
        auVar17._8_4_ = fVar26 * fStack_1d0 + fVar11 * fStack_c0;
        fVar11 = fVar26 * fStack_1cc + fVar11 * fStack_bc;
        iVar6 = iVar6 + 1;
        if (iVar6 < iVar2) {
          do {
            local_198._4_4_ = auVar17._4_4_;
            local_198._0_4_ = auVar17._0_4_;
            fStack_190 = auVar17._8_4_;
            fStack_18c = fVar11;
            fVar26 = ((float)iVar6 / fVar27 - fVar9) / (fVar10 - fVar9);
            fVar22 = 1.0 - fVar26;
            local_1c8 = auVar32._0_4_ * fVar22 + auVar13._0_4_ * fVar26;
            fStack_1c4 = auVar32._4_4_ * fVar22 + auVar13._4_4_ * fVar26;
            fStack_1c0 = auVar32._8_4_ * fVar22 + auVar13._8_4_ * fVar26;
            fStack_1bc = auVar32._12_4_ * fVar22 + fVar35 * fVar26;
            local_148 = fVar22 * auVar29._0_4_ + fVar26 * auVar17._0_4_;
            fStack_144 = fVar22 * auVar29._4_4_ + fVar26 * auVar17._4_4_;
            fStack_140 = fVar22 * auVar29._8_4_ + fVar26 * auVar17._8_4_;
            fStack_13c = fVar22 * auVar29._12_4_ + fVar26 * fVar11;
            local_90 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
            local_158 = auVar13._0_4_;
            fStack_154 = auVar13._4_4_;
            fStack_150 = auVar13._8_4_;
            fStack_14c = fVar35;
            local_88 = fVar12;
            local_84 = iVar6;
            local_80 = &local_138;
            (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                      (&local_90);
            auVar19._0_4_ = (float)local_138 - local_1c8;
            auVar19._4_4_ = local_138._4_4_ - fStack_1c4;
            auVar19._8_4_ = fStack_130 - fStack_1c0;
            auVar19._12_4_ = fStack_12c - fStack_1bc;
            auVar18._0_4_ = (float)local_128 - local_148;
            auVar18._4_4_ = local_128._4_4_ - fStack_144;
            auVar18._8_4_ = fStack_120 - fStack_140;
            auVar18._12_4_ = fStack_11c - fStack_13c;
            auVar14 = minps(auVar19,ZEXT816(0));
            auVar19 = maxps(auVar18,ZEXT816(0));
            auVar31._0_4_ = auVar32._0_4_ + auVar14._0_4_;
            auVar31._4_4_ = auVar32._4_4_ + auVar14._4_4_;
            auVar31._8_4_ = auVar32._8_4_ + auVar14._8_4_;
            auVar32._12_4_ = auVar32._12_4_ + auVar14._12_4_;
            auVar32._0_12_ = auVar31;
            auVar13._0_4_ = auVar14._0_4_ + local_158;
            auVar13._4_4_ = auVar14._4_4_ + fStack_154;
            auVar13._8_4_ = auVar14._8_4_ + fStack_150;
            fVar35 = auVar14._12_4_ + fStack_14c;
            auVar28._0_4_ = auVar29._0_4_ + auVar19._0_4_;
            auVar28._4_4_ = auVar29._4_4_ + auVar19._4_4_;
            auVar28._8_4_ = auVar29._8_4_ + auVar19._8_4_;
            auVar29._12_4_ = auVar29._12_4_ + auVar19._12_4_;
            auVar29._0_12_ = auVar28;
            auVar17._0_4_ = auVar19._0_4_ + (float)local_198._0_4_;
            auVar17._4_4_ = auVar19._4_4_ + (float)local_198._4_4_;
            auVar17._8_4_ = auVar19._8_4_ + fStack_190;
            fVar11 = auVar19._12_4_ + fStack_18c;
            iVar6 = iVar6 + 1;
          } while (iVar2 != iVar6);
        }
        else {
        }
      }
      fVar11 = (float)((this->super_UserGeometry).super_AccelSet.super_Geometry.numTimeSteps - 1);
      uVar7 = (ulong)(uint)fVar11;
      aVar33.m128[3] = (float)geomID;
      aVar33._0_12_ = auVar31;
      aVar30.m128[3] = fVar12;
      aVar30._0_12_ = auVar28;
      aVar15.m128[3] = fVar11;
      aVar15._0_12_ = auVar13;
      aVar20.m128[3] = fVar11;
      aVar20._0_12_ = auVar17;
      auVar23._0_4_ =
           auVar28._0_4_ * 0.5 + auVar17._0_4_ * 0.5 + auVar31._0_4_ * 0.5 + auVar13._0_4_ * 0.5;
      auVar23._4_4_ =
           auVar28._4_4_ * 0.5 + auVar17._4_4_ * 0.5 + auVar31._4_4_ * 0.5 + auVar13._4_4_ * 0.5;
      auVar23._8_4_ =
           auVar28._8_4_ * 0.5 + auVar17._8_4_ * 0.5 + auVar31._8_4_ * 0.5 + auVar13._8_4_ * 0.5;
      auVar23._12_4_ = fVar12 * 0.5 + fVar11 * 0.5 + (float)geomID * 0.5 + fVar11 * 0.5;
      BVar24 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range;
      fVar11 = BVar24.lower;
      fVar12 = BVar24.upper;
      local_178.m128 = (__m128)minps(local_178.m128,aVar33.m128);
      local_1b8 = local_1b8 + 1;
      local_1b0 = local_1b0 + uVar7;
      bVar8 = uVar4 < uVar7;
      if (uVar4 <= uVar7) {
        uVar4 = uVar7;
      }
      pPVar1 = local_e8->items;
      pPVar1[k].lbounds.bounds0.lower.field_0 = aVar33;
      local_168.m128 = (__m128)maxps(local_168.m128,aVar30.m128);
      pPVar1[k].lbounds.bounds0.upper.field_0 = aVar30;
      local_78.m128 = (__m128)minps(local_78.m128,aVar15.m128);
      pPVar1[k].lbounds.bounds1.lower.field_0 = aVar15;
      local_68.m128 = (__m128)maxps(local_68.m128,aVar20.m128);
      pPVar1[k].lbounds.bounds1.upper.field_0 = aVar20;
      pPVar1[k].time_range = BVar24;
      _local_188 = (__m128)minps(_local_188,auVar23);
      local_58.m128 = (__m128)maxps(local_58.m128,auVar23);
      if (fVar11 <= fVar25) {
        fVar25 = fVar11;
      }
      fVar27 = fVar12;
      if (fVar12 <= fVar34) {
        fVar27 = fVar34;
      }
      uVar16 = (int)((uint)bVar8 << 0x1f) >> 0x1f;
      uVar21 = (int)((uint)bVar8 << 0x1f) >> 0x1f;
      local_48 = (float)(~uVar16 & (uint)local_48 | (uint)fVar11 & uVar16);
      fStack_44 = (float)(~uVar21 & (uint)fStack_44 | (uint)fVar12 & uVar21);
      k = k + 1;
      fVar34 = fVar27;
LAB_0094a79d:
      uVar5 = uVar5 + 1;
    } while (uVar5 < local_e0->_end);
    (local_f0->object_range)._end = local_1b8;
  }
  else {
    local_48 = 0.0;
    fStack_44 = 1.0;
    local_188._0_4_ = (undefined4)DAT_01f7a9f0;
    local_188._4_4_ = DAT_01f7a9f0._4_4_;
    fStack_180 = DAT_01f7a9f0._8_4_;
    fStack_17c = DAT_01f7a9f0._12_4_;
    fVar25 = 1.0;
    fVar34 = 0.0;
    uVar4 = 0;
    local_1b0 = 0;
    local_168 = _DAT_01f7aa00;
    local_178 = _DAT_01f7a9f0;
  }
  (local_f0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0 =
       local_178;
  (local_f0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.field_0 =
       local_168;
  (local_f0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.field_0 =
       local_78;
  (local_f0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.field_0 =
       local_68;
  (local_f0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.m128[0] =
       (float)local_188._0_4_;
  (local_f0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.m128[1] =
       (float)local_188._4_4_;
  (local_f0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.m128[2] =
       fStack_180;
  (local_f0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.m128[3] =
       fStack_17c;
  (local_f0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0 = local_58;
  (local_f0->time_range).lower = fVar25;
  (local_f0->time_range).upper = fVar34;
  local_f0->num_time_segments = local_1b0;
  local_f0->max_num_time_segments = uVar4;
  (local_f0->max_time_range).lower = local_48;
  (local_f0->max_time_range).upper = fStack_44;
  return local_f0;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const PrimRefMB prim(linearBounds(j,t0t1),this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }